

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall cmCTest::TryToChangeDirectory(cmCTest *this,string *dir)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_408 [32];
  undefined1 local_3e8 [8];
  ostringstream cmCTestLog_msg_1;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  undefined1 local_1f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> msg;
  Status status;
  ostringstream local_198 [8];
  ostringstream cmCTestLog_msg;
  string *dir_local;
  cmCTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar2 = std::operator<<((ostream *)local_198,"Internal ctest changing into directory: ");
  poVar2 = std::operator<<(poVar2,(string *)dir);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  Log(this,1,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x653,pcVar3,false);
  std::__cxx11::string::~string((string *)&status);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  msg.field_2._8_8_ = cmsys::SystemTools::ChangeDirectory(dir);
  bVar1 = cmsys::Status::operator_cast_to_bool((Status *)((long)&msg.field_2 + 8));
  if (!bVar1) {
    std::operator+(&local_250,"Failed to change working directory to \"",dir);
    std::operator+(&local_230,&local_250,"\" : ");
    cmsys::Status::GetString_abi_cxx11_(&local_270,(Status *)((long)&msg.field_2 + 8));
    std::operator+(&local_210,&local_230,&local_270);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                   &local_210,"\n");
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
    std::operator<<((ostream *)local_3e8,(string *)local_1f0);
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x658,pcVar3,false);
    std::__cxx11::string::~string(local_408);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
    std::__cxx11::string::~string((string *)local_1f0);
  }
  return bVar1;
}

Assistant:

bool cmCTest::TryToChangeDirectory(std::string const& dir)
{
  cmCTestLog(this, OUTPUT,
             "Internal ctest changing into directory: " << dir << std::endl);
  cmsys::Status status = cmSystemTools::ChangeDirectory(dir);
  if (!status) {
    auto msg = "Failed to change working directory to \"" + dir +
      "\" : " + status.GetString() + "\n";
    cmCTestLog(this, ERROR_MESSAGE, msg);
    return false;
  }
  return true;
}